

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.h
# Opt level: O0

Box * __thiscall libDAI::Box::normalized(Box *this)

{
  TProb<double> *pTVar1;
  Box *in_RDI;
  Box *in_stack_00000028;
  size_t l;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> ep;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *in_stack_00000060;
  VarSet *in_stack_00000068;
  Box *in_stack_00000070;
  NormType in_stack_ffffffffffffffcc;
  TProb<double> *pTVar2;
  TProb<double> *this_00;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> local_28;
  
  extremePoints(in_stack_00000028);
  pTVar2 = (TProb<double> *)0x0;
  while( true ) {
    this_00 = pTVar2;
    pTVar1 = (TProb<double> *)
             std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::size
                       (&local_28);
    if (pTVar1 <= pTVar2) break;
    std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::operator[]
              (&local_28,(size_type)this_00);
    TProb<double>::normalize(this_00,in_stack_ffffffffffffffcc);
    pTVar2 = (TProb<double> *)
             ((long)&(this_00->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start + 1);
  }
  Box(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::~vector
            ((vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *)in_RDI);
  return in_RDI;
}

Assistant:

Box normalized() const {
                std::vector<Prob> ep = extremePoints();
                for( size_t l = 0; l < ep.size(); l++ )
                    ep[l].normalize();
                return Box( _vars, ep );
            }